

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeModel::emitDataChanged(QTreeModel *this,QTreeWidgetItem *item,int column,QList<int> *roles)

{
  bool bVar1;
  Data *pDVar2;
  int iVar3;
  long in_FS_OFFSET;
  Data *local_68;
  QTreeWidgetItem *pQStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  Data *local_48;
  QTreeWidgetItem *pQStack_40;
  QTreeWidgetItem *pQStack_38;
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x30) & 2) == 0) {
    if ((this->headerItem == item) && (column < (int)(item->values).d.size)) {
      if (column != -1) {
        if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
          QAbstractItemModel::headerDataChanged((Orientation)this,1,column);
          return;
        }
        goto LAB_005bb57b;
      }
      local_48 = (Data *)0xffffffffffffffff;
      pQStack_40 = (QTreeWidgetItem *)0x0;
      pQStack_38 = (QTreeWidgetItem *)0x0;
      (**(code **)(*(long *)this + 0x80))(this);
      QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
    }
    else {
      bVar1 = this->skipPendingSort;
      this->skipPendingSort = true;
      local_48 = (Data *)0xffffffffffffffff;
      pQStack_40 = (QTreeWidgetItem *)0x0;
      pQStack_38 = (QTreeWidgetItem *)0x0;
      local_68 = (Data *)0xffffffffffffffff;
      pQStack_60 = (QTreeWidgetItem *)0x0;
      local_58.ptr = (QAbstractItemModel *)0x0;
      if (column == -1) {
        index((QTreeModel *)&local_68,(char *)this,(int)item);
        pDVar2 = local_68;
        iVar3 = (**(code **)(*(long *)this + 0x80))(this);
        local_48 = (Data *)CONCAT44(iVar3 + -1,(int)pDVar2);
        pQStack_40 = item;
        pQStack_38 = (QTreeWidgetItem *)this;
      }
      else {
        index((QTreeModel *)&local_68,(char *)this,(int)item);
        pQStack_38 = (QTreeWidgetItem *)local_58.ptr;
        local_48 = local_68;
        pQStack_40 = pQStack_60;
      }
      QAbstractItemModel::dataChanged
                ((QModelIndex *)this,(QModelIndex *)&local_68,(QList_conflict *)&local_48);
      this->skipPendingSort = bVar1;
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_005bb57b:
  __stack_chk_fail();
}

Assistant:

void QTreeModel::emitDataChanged(QTreeWidgetItem *item, int column, const QList<int> &roles)
{
    if (signalsBlocked())
        return;

    if (headerItem == item && column < item->columnCount()) {
        if (column == -1)
            emit headerDataChanged(Qt::Horizontal, 0, columnCount() - 1);
        else
            emit headerDataChanged(Qt::Horizontal, column, column);
        return;
    }

    SkipSorting skipSorting(this); //This is a little bit wrong, but not doing it would kill performance

    QModelIndex bottomRight, topLeft;
    if (column == -1) {
        topLeft = index(item, 0);
        bottomRight = createIndex(topLeft.row(), columnCount() - 1, item);
    } else {
        topLeft = index(item, column);
        bottomRight = topLeft;
    }
    emit dataChanged(topLeft, bottomRight, roles);
}